

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshalling.cc
# Opt level: O1

bool __thiscall
absl::flags_internal::ParseFlagImpl<unsigned_int>(flags_internal *this,string_view text,uint *dst)

{
  bool bVar1;
  int base;
  undefined8 in_RAX;
  flags_internal *pfVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  flags_internal *this_00;
  string_view sVar7;
  string_view text_00;
  uint32_t val;
  uint local_24;
  
  local_24 = (uint)((ulong)in_RAX >> 0x20);
  sVar7 = StripLeadingAsciiWhitespace((absl *)this,text);
  pcVar4 = sVar7._M_str;
  pfVar2 = (flags_internal *)sVar7._M_len;
  pcVar3 = pcVar4 + (long)pfVar2;
  pcVar6 = pcVar3;
  if (0 < (long)pfVar2 >> 2) {
    pcVar6 = pcVar4 + ((uint)sVar7._M_len & 3);
    pcVar5 = (char *)(((long)pfVar2 >> 2) + 1);
    do {
      if (((&ascii_internal::kPropertyBits)[(byte)pcVar3[-1]] & 8) == 0) goto LAB_00125305;
      if (((&ascii_internal::kPropertyBits)[(byte)pcVar3[-2]] & 8) == 0) {
        pcVar3 = pcVar3 + -1;
        goto LAB_00125305;
      }
      if (((&ascii_internal::kPropertyBits)[(byte)pcVar3[-3]] & 8) == 0) {
        pcVar3 = pcVar3 + -2;
        goto LAB_00125305;
      }
      if (((&ascii_internal::kPropertyBits)[(byte)pcVar3[-4]] & 8) == 0) {
        pcVar3 = pcVar3 + -3;
        goto LAB_00125305;
      }
      pcVar3 = pcVar3 + -4;
      pcVar5 = pcVar5 + -1;
    } while (1 < (long)pcVar5);
  }
  pcVar5 = pcVar6 + -(long)pcVar4;
  if (pcVar5 != (char *)0x1) {
    if (pcVar5 != (char *)0x2) {
      pcVar3 = pcVar4;
      if ((pcVar5 != (char *)0x3) ||
         (pcVar5 = (char *)(ulong)(byte)pcVar6[-1], pcVar3 = pcVar6, (pcVar5[0x162d20] & 8U) == 0))
      goto LAB_00125305;
      pcVar6 = pcVar6 + -1;
    }
    pcVar5 = (char *)(ulong)(byte)pcVar6[-1];
    pcVar3 = pcVar6;
    if ((pcVar5[0x162d20] & 8U) == 0) goto LAB_00125305;
    pcVar6 = pcVar6 + -1;
  }
  pcVar5 = (char *)(ulong)(byte)pcVar6[-1];
  pcVar3 = pcVar6;
  if ((pcVar5[0x162d20] & 8U) != 0) {
    pcVar3 = pcVar4;
  }
LAB_00125305:
  this_00 = (flags_internal *)(pcVar3 + -(long)pcVar4);
  if (pfVar2 < (flags_internal *)(pcVar3 + -(long)pcVar4)) {
    this_00 = pfVar2;
  }
  sVar7._M_str = pcVar5;
  sVar7._M_len = (size_t)pcVar4;
  base = NumericBase(this_00,sVar7);
  text_00._M_str = pcVar4;
  text_00._M_len = (size_t)this_00;
  bVar1 = numbers_internal::safe_strtou32_base(text_00,&local_24,base);
  *(uint *)text._M_str = local_24;
  return bVar1;
}

Assistant:

inline bool ParseFlagImpl(absl::string_view text, IntType& dst) {
  text = absl::StripAsciiWhitespace(text);

  return absl::numbers_internal::safe_strtoi_base(text, &dst,
                                                  NumericBase(text));
}